

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

int __thiscall
kj::CapabilityStreamNetworkAddress::connect
          (CapabilityStreamNetworkAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  _func_int *p_Var2;
  Disposer *pDVar3;
  AsyncCapabilityStream *pAVar4;
  void *pvVar5;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2789:13)>
  *location;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> result;
  void *continuationTracePtr;
  CapabilityPipe pipe;
  undefined1 local_a0 [8];
  CapabilityPipe local_98;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_78;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_68;
  code *local_60;
  CapabilityPipe local_58;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  local_58.ends[1].disposer = (Disposer *)0x0;
  local_58.ends[1].ptr = (AsyncCapabilityStream *)0x0;
  local_58.ends[0].disposer = (Disposer *)0x0;
  local_58.ends[0].ptr = (AsyncCapabilityStream *)0x0;
  plVar1 = *(long **)(CONCAT44(in_register_00000034,__fd) + 8);
  if (plVar1 == (long *)0x0) {
    newCapabilityPipe();
    CapabilityPipe::operator=(&local_58,&local_98);
    CapabilityPipe::~CapabilityPipe(&local_98);
  }
  else {
    (**(code **)(*plVar1 + 0x10))(&local_98,plVar1,__addr,CONCAT44(in_register_0000000c,__len));
    CapabilityPipe::operator=(&local_58,&local_98);
    CapabilityPipe::~CapabilityPipe(&local_98);
  }
  pAVar4 = local_58.ends[0].ptr;
  pDVar3 = local_58.ends[0].disposer;
  local_98.ends[0].disposer = local_58.ends[0].disposer;
  local_58.ends[0].ptr = (AsyncCapabilityStream *)0x0;
  local_98.ends[0].ptr = pAVar4;
  local_38.disposer = local_58.ends[1].disposer;
  local_38.ptr = local_58.ends[1].ptr;
  local_58.ends[1].ptr = (AsyncCapabilityStream *)0x0;
  AsyncCapabilityStream::sendStream
            ((AsyncCapabilityStream *)local_a0,
             *(Own<kj::AsyncCapabilityStream,_std::nullptr_t> **)
              (CONCAT44(in_register_00000034,__fd) + 0x10));
  local_78.disposer = pDVar3;
  local_98.ends[0].ptr = (AsyncCapabilityStream *)0x0;
  local_78.ptr = pAVar4;
  local_60 = kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2789:13)>
             ::anon_class_16_1_6971b95b_for_func::operator();
  p_Var2 = *(_func_int **)((long)local_a0 + 8);
  if (p_Var2 == (_func_int *)0x0 || (ulong)((long)local_a0 - (long)p_Var2) < 0x30) {
    pvVar5 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2789:13)>
                *)((long)pvVar5 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::CapabilityStreamNetworkAddress::connect()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::CapabilityStreamNetworkAddress::connect()::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0,
               (anon_class_16_1_6971b95b_for_func *)&local_78,&local_60);
    *(void **)((long)pvVar5 + 0x3d8) = pvVar5;
  }
  else {
    *(_func_int **)((long)local_a0 + 8) = (_func_int *)0x0;
    location = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2789:13)>
                *)((long)local_a0 + -0x30);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::CapabilityStreamNetworkAddress::connect()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::CapabilityStreamNetworkAddress::connect()::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0,
               (anon_class_16_1_6971b95b_for_func *)&local_78,&local_60);
    *(_func_int **)((long)local_a0 + -0x28) = p_Var2;
  }
  local_68.ptr = (PromiseNode *)0x0;
  (this->super_NetworkAddress)._vptr_NetworkAddress = (_func_int **)location;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&local_78);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&local_38);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(local_98.ends);
  CapabilityPipe::~CapabilityPipe(&local_58);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamNetworkAddress::connect() {
  CapabilityPipe pipe;
  KJ_IF_SOME(p, provider) {
    pipe = p.newCapabilityPipe();
  } else {
    pipe = kj::newCapabilityPipe();
  }